

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

bool __thiscall cmGhsMultiTargetGenerator::DetermineIfIntegrityApp(cmGhsMultiTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  string *this_01;
  iterator iVar2;
  iterator iVar3;
  string_view val;
  undefined1 local_80 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue p;
  cmGhsMultiTargetGenerator *this_local;
  
  this_00 = this->GeneratorTarget;
  p.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ghs_integrity_app",&local_41);
  local_20 = cmGeneratorTarget::GetProperty(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    this_01 = cmValue::operator*[abi_cxx11_(&local_20);
    val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)val._M_len;
    this_local._7_1_ = cmIsOn(val);
  }
  else {
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80);
    cmGeneratorTarget::GetSourceFiles
              (this->GeneratorTarget,
               (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80,&this->ConfigName
              );
    iVar2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                      ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80);
    iVar3 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                      ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80);
    this_local._7_1_ =
         std::
         any_of<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()::__0>
                   (iVar2._M_current,iVar3._M_current);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_80);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()
{
  if (cmValue p = this->GeneratorTarget->GetProperty("ghs_integrity_app")) {
    return cmIsOn(*p);
  }
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);
  return std::any_of(sources.begin(), sources.end(),
                     [](cmSourceFile const* sf) -> bool {
                       return "int" == sf->GetExtension();
                     });
}